

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexicon.cpp
# Opt level: O0

void __thiscall Lexico::Token(Lexico *this,int final)

{
  int final_local;
  Lexico *this_local;
  
  switch(final) {
  case 3:
    Tokens::setToken(&this->super_Tokens,3);
    break;
  case 4:
    Tokens::setToken(&this->super_Tokens,4);
    break;
  case 5:
    Tokens::setToken(&this->super_Tokens,5);
    break;
  case 6:
    Tokens::setToken(&this->super_Tokens,6);
    break;
  case 7:
    Tokens::setToken(&this->super_Tokens,7);
    break;
  case 8:
    Tokens::setToken(&this->super_Tokens,8);
    break;
  case 9:
    Tokens::setToken(&this->super_Tokens,9);
    break;
  case 10:
    Tokens::setToken(&this->super_Tokens,10);
    break;
  case 0xb:
    Tokens::setToken(&this->super_Tokens,0xb);
    break;
  case 0xc:
    Tokens::setToken(&this->super_Tokens,0xc);
    break;
  case 0xd:
    Tokens::setToken(&this->super_Tokens,0xd);
    break;
  case 0xe:
    Tokens::setToken(&this->super_Tokens,0xe);
    break;
  case 0xf:
    Tokens::setToken(&this->super_Tokens,0xf);
    break;
  case 0x10:
    Tokens::setToken(&this->super_Tokens,0x10);
    break;
  case 0x11:
    Tokens::setToken(&this->super_Tokens,0x11);
    break;
  case 0x12:
    Tokens::setToken(&this->super_Tokens,0x12);
    break;
  case 0x13:
    Tokens::setToken(&this->super_Tokens,0x13);
    break;
  case 0x14:
    Tokens::setToken(&this->super_Tokens,0x14);
    break;
  case 0x15:
    Tokens::setToken(&this->super_Tokens,0x15);
    break;
  case 0x16:
    Tokens::setToken(&this->super_Tokens,0x16);
    break;
  case 0x17:
    Tokens::setToken(&this->super_Tokens,0x17);
    break;
  case 0x18:
    Tokens::setToken(&this->super_Tokens,0x18);
    break;
  case 0x19:
    Tokens::setToken(&this->super_Tokens,0x19);
    break;
  case 0x1a:
    Tokens::setToken(&this->super_Tokens,0x1a);
    break;
  case 0x1b:
    Tokens::setToken(&this->super_Tokens,0x1b);
    break;
  case 0x1c:
    Tokens::setToken(&this->super_Tokens,0x1c);
    break;
  case 0x1d:
    Tokens::setToken(&this->super_Tokens,0x1d);
    break;
  case 0x1e:
    break;
  case 0x2c:
    Tokens::setToken(&this->super_Tokens,2);
  }
  return;
}

Assistant:

void Lexico::Token (int final) {
	switch (final) {
		case 3 : Tokens::setToken (3) ; break;
		case 4 : Tokens::setToken (4) ; break;
    case 5 : Tokens::setToken (5) ; break;
    case 6 : Tokens::setToken (6) ; break;
		case 7 : Tokens::setToken (7) ; break;
		case 8 : Tokens::setToken (8) ; break;
		case 9 : Tokens::setToken (9) ; break;
		case 10: Tokens::setToken (10); break;
		case 11: Tokens::setToken (11); break;
    case 12: Tokens::setToken (12); break;
    case 13: Tokens::setToken (13); break;
    case 14: Tokens::setToken (14); break;
    case 15: Tokens::setToken (15); break;
    case 16: Tokens::setToken (16); break;
    case 17: Tokens::setToken (17); break;
    case 18: Tokens::setToken (18); break;
    case 19: Tokens::setToken (19); break;
    case 20: Tokens::setToken (20); break;
    case 21: Tokens::setToken (21); break;
    case 22: Tokens::setToken (22); break;
    case 23: Tokens::setToken (23); break;
    case 24: Tokens::setToken (24); break;
    case 25: Tokens::setToken (25); break;
    case 26: Tokens::setToken (26); break;
    case 27: Tokens::setToken (27); break;
    case 28: Tokens::setToken (28); break;
    case 29: Tokens::setToken (29); break;
    case UNDER: Tokens::setToken (2) ; break;
    case ABSOLUTE: break;
  }
}